

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintJste(TidyDocImpl *doc,uint indent,Node *node)

{
  uint mode;
  uint saveWrap;
  
  saveWrap = WrapOffCond(doc,(uint)(*(int *)((doc->config).value + 0x5a) == 0));
  AddString(&doc->pprint,"<#");
  mode = 0x10;
  if (*(int *)((doc->config).value + 0x5c) == 0) {
    mode = 2;
  }
  PPrintText(doc,mode,indent,node);
  AddString(&doc->pprint,"#>");
  WrapOn(doc,saveWrap);
  return;
}

Assistant:

static void PPrintJste( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapAsp = cfgBool( doc, TidyWrapAsp );
    uint saveWrap = WrapOffCond( doc, !wrapAsp  );

    AddString( pprint, "<#" );
    PPrintText( doc, (cfgBool(doc, TidyWrapJste) ? CDATA : COMMENT),
                indent, node );
    AddString( pprint, "#>" );

    /* PCondFlushLine( doc, indent ); */
    WrapOn( doc, saveWrap );
}